

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

re2 * __thiscall re2::CEscape_abi_cxx11_(re2 *this,StringPiece *src)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  allocator local_2e;
  undefined1 local_2d;
  int local_2c;
  char *pcStack_28;
  int len;
  char *dest;
  StringPiece *pSStack_18;
  int dest_length;
  StringPiece *src_local;
  string *s;
  
  pSStack_18 = src;
  src_local = (StringPiece *)this;
  iVar1 = StringPiece::size(src);
  dest._4_4_ = iVar1 * 4 + 1;
  uVar3 = (ulong)dest._4_4_;
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pcStack_28 = (char *)operator_new__(uVar3);
  pcVar2 = StringPiece::data(pSStack_18);
  iVar1 = StringPiece::size(pSStack_18);
  local_2c = CEscapeString(pcVar2,iVar1,pcStack_28,dest._4_4_);
  pcVar2 = pcStack_28;
  local_2d = 0;
  uVar3 = (ulong)local_2c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar2,uVar3,&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  if (pcStack_28 != (char *)0x0) {
    operator_delete__(pcStack_28);
  }
  return this;
}

Assistant:

string CEscape(const StringPiece& src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  char* dest = new char[dest_length];
  const int len = CEscapeString(src.data(), src.size(),
                                dest, dest_length);
  string s = string(dest, len);
  delete[] dest;
  return s;
}